

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# propagateNoContraction.cpp
# Opt level: O1

void glslang::PropagateNoContraction(TIntermediate *intermediate)

{
  TIntermNode *pTVar1;
  ulong uVar2;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glslang::TIntermOperator_*>,_true>
  _Var3;
  undefined8 uVar4;
  bool bVar5;
  long *plVar6;
  size_type sVar7;
  long *plVar8;
  long lVar9;
  long *plVar10;
  _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glslang::TIntermOperator_*>,_false,_true>
  __tmp;
  key_type pTVar11;
  pair<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glslang::TIntermOperator_*>,_false,_true>,_std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glslang::TIntermOperator_*>,_false,_true>_>
  pVar12;
  TIntermBranch *precise_return_node;
  ObjectAccessChain precise_object_accesschain;
  ObjectAccessChain assignee_object;
  TNoContractionAssigneeCheckingTraverser checker;
  ObjectAccessChain symbol_id;
  TNoContractionPropagator propagator;
  tuple<std::unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glslang::TIntermOperator_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glslang::TIntermOperator_*>_>_>,_std::unordered_map<glslang::TIntermTyped_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<glslang::TIntermTyped_*>,_std::equal_to<glslang::TIntermTyped_*>,_std::allocator<std::pair<glslang::TIntermTyped_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::unordered_set<glslang::TIntermBranch_*,_std::hash<glslang::TIntermBranch_*>,_std::equal_to<glslang::TIntermBranch_*>,_std::allocator<glslang::TIntermBranch_*>_>_>
  mappings_and_precise_objects;
  key_type local_2e8;
  size_type local_2e0;
  undefined1 local_2d8 [16];
  undefined1 local_2c8 [17];
  uint7 uStack_2b7;
  TString *pTStack_2b0;
  char *local_2a8;
  size_t sStack_2a0;
  undefined1 local_298 [16];
  undefined1 local_288 [32];
  undefined1 local_268 [32];
  TString *local_248;
  TString *pTStack_240;
  __node_base_ptr local_238 [2];
  undefined1 local_228 [8];
  bool bStack_220;
  undefined7 uStack_21f;
  undefined4 uStack_218;
  undefined4 uStack_214;
  anon_union_8_2_8ac53c11_for_TType_13 aStack_210;
  TString *local_208;
  TString *pTStack_200;
  undefined1 local_1f8 [16];
  TSpirvType *local_1e8;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glslang::TIntermOperator_*>,_true>
  local_1e0;
  ObjectAccessChain local_1d8;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glslang::TIntermOperator_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glslang::TIntermOperator_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_false>_>
  local_1b8;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glslang::TIntermOperator_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glslang::TIntermOperator_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_false>_>
  *local_180;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_178;
  undefined1 *local_140;
  char *local_138;
  undefined1 local_130;
  undefined7 uStack_12f;
  _Hashtable<glslang::TIntermTyped_*,_std::pair<glslang::TIntermTyped_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<glslang::TIntermTyped_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<glslang::TIntermTyped_*>,_std::hash<glslang::TIntermTyped_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *local_120;
  _Hashtable<glslang::TIntermBranch_*,_glslang::TIntermBranch_*,_std::allocator<glslang::TIntermBranch_*>,_std::__detail::_Identity,_std::equal_to<glslang::TIntermBranch_*>,_std::hash<glslang::TIntermBranch_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_110;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_d8;
  _Hashtable<glslang::TIntermTyped_*,_std::pair<glslang::TIntermTyped_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<glslang::TIntermTyped_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<glslang::TIntermTyped_*>,_std::hash<glslang::TIntermTyped_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_a0;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glslang::TIntermOperator_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glslang::TIntermOperator_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_false>_>
  local_68;
  
  local_1b8._M_buckets = &local_1b8._M_single_bucket;
  local_1b8._M_before_begin._M_nxt._0_4_ = 0;
  local_1b8._M_before_begin._M_nxt._4_4_ = 0;
  local_1b8._M_element_count = 0;
  local_1b8._M_bucket_count._0_1_ = 1;
  local_1b8._M_bucket_count._1_7_ = 0;
  local_1b8._M_rehash_policy._M_max_load_factor = 1.0;
  local_1b8._M_rehash_policy._4_4_ = 0;
  local_1b8._M_rehash_policy._M_next_resize = 0;
  local_1b8._M_single_bucket = (__node_base_ptr)0x0;
  local_228 = (undefined1  [8])(local_228 + 0x30);
  uStack_218 = 0;
  uStack_214 = 0;
  aStack_210.structure = (TTypeList *)0x0;
  bStack_220 = true;
  uStack_21f._0_1_ = false;
  uStack_21f._1_6_ = 0;
  local_208 = (TString *)0x3f800000;
  pTStack_200 = (TString *)0x0;
  local_1f8._0_8_ = (__node_base_ptr)0x0;
  local_2c8._0_8_ = local_298;
  stack0xfffffffffffffd48 = (_Hash_node_base *)0x0;
  pTStack_2b0 = (TString *)0x0;
  local_2c8._8_8_ = 1;
  local_2a8 = (char *)0x3f800000;
  sStack_2a0 = 0;
  local_298._0_8_ = (__node_base_ptr)0x0;
  local_268._0_8_ = local_268 + 0x30;
  local_268._16_8_ = (_Hash_node_base *)0x0;
  local_268._24_8_ = (TTypeList *)0x0;
  local_268._8_8_ = 1;
  local_248 = (TString *)0x3f800000;
  pTStack_240 = (TString *)0x0;
  local_238[0] = (__node_base_ptr)0x0;
  std::
  _Tuple_impl<1ul,std::unordered_map<glslang::TIntermTyped*,std::__cxx11::string,std::hash<glslang::TIntermTyped*>,std::equal_to<glslang::TIntermTyped*>,std::allocator<std::pair<glslang::TIntermTyped*const,std::__cxx11::string>>>,std::unordered_set<std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::__cxx11::string>>,std::unordered_set<glslang::TIntermBranch*,std::hash<glslang::TIntermBranch*>,std::equal_to<glslang::TIntermBranch*>,std::allocator<glslang::TIntermBranch*>>>
  ::
  _Tuple_impl<std::unordered_map<glslang::TIntermTyped*,std::__cxx11::string,std::hash<glslang::TIntermTyped*>,std::equal_to<glslang::TIntermTyped*>,std::allocator<std::pair<glslang::TIntermTyped*const,std::__cxx11::string>>>,std::unordered_set<std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::__cxx11::string>>,std::unordered_set<glslang::TIntermBranch*,std::hash<glslang::TIntermBranch*>,std::equal_to<glslang::TIntermBranch*>,std::allocator<glslang::TIntermBranch*>>,void>
            ((_Tuple_impl<1ul,std::unordered_map<glslang::TIntermTyped*,std::__cxx11::string,std::hash<glslang::TIntermTyped*>,std::equal_to<glslang::TIntermTyped*>,std::allocator<std::pair<glslang::TIntermTyped*const,std::__cxx11::string>>>,std::unordered_set<std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::__cxx11::string>>,std::unordered_set<glslang::TIntermBranch*,std::hash<glslang::TIntermBranch*>,std::equal_to<glslang::TIntermBranch*>,std::allocator<glslang::TIntermBranch*>>>
              *)&local_110,
             (unordered_map<glslang::TIntermTyped_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<glslang::TIntermTyped_*>,_std::equal_to<glslang::TIntermTyped_*>,_std::allocator<std::pair<glslang::TIntermTyped_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_228,
             (unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_2c8,
             (unordered_set<glslang::TIntermBranch_*,_std::hash<glslang::TIntermBranch_*>,_std::equal_to<glslang::TIntermBranch_*>,_std::allocator<glslang::TIntermBranch_*>_>
              *)local_268);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glslang::TIntermOperator_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glslang::TIntermOperator_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_false>_>
  ::_Hashtable(&local_68,&local_1b8,&local_1b8);
  std::
  _Hashtable<glslang::TIntermBranch_*,_glslang::TIntermBranch_*,_std::allocator<glslang::TIntermBranch_*>,_std::__detail::_Identity,_std::equal_to<glslang::TIntermBranch_*>,_std::hash<glslang::TIntermBranch_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<glslang::TIntermBranch_*,_glslang::TIntermBranch_*,_std::allocator<glslang::TIntermBranch_*>,_std::__detail::_Identity,_std::equal_to<glslang::TIntermBranch_*>,_std::hash<glslang::TIntermBranch_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_268);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)local_2c8);
  std::
  _Hashtable<glslang::TIntermTyped_*,_std::pair<glslang::TIntermTyped_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<glslang::TIntermTyped_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<glslang::TIntermTyped_*>,_std::hash<glslang::TIntermTyped_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<glslang::TIntermTyped_*,_std::pair<glslang::TIntermTyped_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<glslang::TIntermTyped_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<glslang::TIntermTyped_*>,_std::hash<glslang::TIntermTyped_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)local_228);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glslang::TIntermOperator_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glslang::TIntermOperator_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_false>_>
  ::~_Hashtable(&local_1b8);
  pTVar1 = intermediate->treeRoot;
  if (pTVar1 != (TIntermNode *)0x0) {
    local_1b8._M_buckets = (__buckets_ptr)&PTR__TIntermTraverser_00b096d8;
    local_1b8._M_bucket_count._0_1_ = 1;
    local_1b8._M_element_count = 0;
    local_1b8._M_rehash_policy._M_max_load_factor = 0.0;
    local_1b8._M_rehash_policy._4_4_ = 0;
    local_1b8._M_rehash_policy._M_next_resize = 0;
    local_1b8._M_single_bucket = (__node_base_ptr)0x0;
    local_1b8._M_bucket_count._1_7_ = 0;
    local_1b8._M_before_begin._M_nxt._0_4_ = 0;
    local_1b8._M_element_count = (size_type)GetThreadPoolAllocator();
    local_1b8._M_rehash_policy._M_max_load_factor = 0.0;
    local_1b8._M_rehash_policy._4_4_ = 0;
    local_1b8._M_rehash_policy._M_next_resize = 0;
    local_1b8._M_single_bucket = (__node_base_ptr)0x0;
    local_1b8._M_buckets = (__buckets_ptr)&PTR__TSymbolDefinitionCollectingTraverser_00b12fd0;
    local_180 = &local_68;
    local_178._M_bucket_count = (size_type)&local_110;
    local_178._M_element_count = 0;
    local_178._M_rehash_policy._0_8_ = local_178._M_rehash_policy._0_8_ & 0xffffffffffffff00;
    local_178._M_single_bucket = (__node_base_ptr)&local_a0;
    local_140 = (undefined1 *)0x0;
    local_178._M_buckets = (__buckets_ptr)&local_d8;
    local_178._M_before_begin._M_nxt = (_Hash_node_base *)&local_178._M_rehash_policy;
    (*pTVar1->_vptr_TIntermNode[2])(pTVar1);
    local_1b8._M_buckets = (__buckets_ptr)&PTR__TSymbolDefinitionCollectingTraverser_00b12fd0;
    if ((_Prime_rehash_policy *)local_178._M_before_begin._M_nxt != &local_178._M_rehash_policy) {
      operator_delete(local_178._M_before_begin._M_nxt,local_178._M_rehash_policy._0_8_ + 1);
    }
  }
  local_228 = (undefined1  [8])&PTR__TIntermTraverser_00b096d8;
  bStack_220 = true;
  aStack_210.structure = (TTypeList *)0x0;
  local_208 = (TString *)0x0;
  pTStack_200 = (TString *)0x0;
  local_1f8._0_8_ = (__node_base_ptr)0x0;
  uStack_21f._0_1_ = false;
  uStack_21f._1_6_ = 0;
  uStack_218 = 0;
  aStack_210.structure = (TTypeList *)GetThreadPoolAllocator();
  local_208 = (TString *)0x0;
  pTStack_200 = (TString *)0x0;
  local_1f8._0_8_ = (__node_base_ptr)0x0;
  local_228 = (undefined1  [8])&PTR__TIntermTraverser_00b13038;
  local_1e8 = (TSpirvType *)0x0;
  local_1b8._M_buckets = (__buckets_ptr)&PTR__TIntermTraverser_00b096d8;
  local_1b8._M_bucket_count._0_1_ = 1;
  local_1b8._M_element_count = 0;
  local_1b8._M_rehash_policy._M_max_load_factor = 0.0;
  local_1b8._M_rehash_policy._4_4_ = 0;
  local_1b8._M_rehash_policy._M_next_resize = 0;
  local_1b8._M_single_bucket = (__node_base_ptr)0x0;
  local_1b8._M_bucket_count._1_7_ = 0;
  local_1b8._M_before_begin._M_nxt._0_4_ = 0;
  local_1f8._8_8_ = &local_a0;
  local_1b8._M_element_count = (size_type)GetThreadPoolAllocator();
  local_1b8._M_rehash_policy._M_max_load_factor = 0.0;
  local_1b8._M_rehash_policy._4_4_ = 0;
  local_1b8._M_rehash_policy._M_next_resize = 0;
  local_1b8._M_single_bucket = (__node_base_ptr)0x0;
  local_1b8._M_buckets = (__buckets_ptr)&PTR__TNoContractionPropagator_00b130a0;
  local_178._M_bucket_count = 1;
  local_178._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_178._M_element_count = 0;
  local_178._M_rehash_policy._M_max_load_factor = 1.0;
  local_178._M_rehash_policy._4_4_ = 0;
  local_178._M_rehash_policy._M_next_resize = 0;
  local_178._M_single_bucket = (__node_base_ptr)0x0;
  local_140 = &local_130;
  local_138 = (char *)0x0;
  local_130 = 0;
  local_180 = (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glslang::TIntermOperator_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glslang::TIntermOperator_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_false>_>
               *)&local_d8;
  local_178._M_buckets = &local_178._M_single_bucket;
  local_120 = &local_a0;
  if (local_110._M_element_count != 0) {
    do {
      pTVar11 = (key_type)local_110._M_before_begin._M_nxt[1]._M_nxt;
      local_2c8._0_8_ = pTVar11;
      std::__cxx11::string::_M_replace((ulong)&local_140,0,local_138,0x8048f6);
      if ((*(int *)&(pTVar11->type)._vptr_TType != 0x16a) ||
         (plVar10 = *(long **)&(pTVar11->type).field_0x8, plVar10 == (long *)0x0)) {
        __assert_fail("return_node->getFlowOp() == glslang::EOpReturn && return_node->getExpression()"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/propagateNoContraction.cpp"
                      ,0x28e,
                      "void (anonymous namespace)::TNoContractionPropagator::propagateNoContractionInReturnNode(glslang::TIntermBranch *)"
                     );
      }
      (**(code **)(*plVar10 + 0x10))(plVar10,&local_1b8);
      std::
      _Hashtable<glslang::TIntermBranch_*,_glslang::TIntermBranch_*,_std::allocator<glslang::TIntermBranch_*>,_std::__detail::_Identity,_std::equal_to<glslang::TIntermBranch_*>,_std::hash<glslang::TIntermBranch_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::_M_erase(&local_110);
    } while (local_110._M_element_count != 0);
  }
  do {
    if (local_d8._M_element_count == 0) {
      local_1b8._M_buckets = (__buckets_ptr)&PTR__TNoContractionPropagator_00b130a0;
      if (local_140 != &local_130) {
        operator_delete(local_140,CONCAT71(uStack_12f,local_130) + 1);
      }
      std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::~_Hashtable(&local_178);
      std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glslang::TIntermOperator_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glslang::TIntermOperator_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_false>_>
      ::~_Hashtable(&local_68);
      std::
      _Hashtable<glslang::TIntermTyped_*,_std::pair<glslang::TIntermTyped_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<glslang::TIntermTyped_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<glslang::TIntermTyped_*>,_std::hash<glslang::TIntermTyped_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable(&local_a0);
      std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::~_Hashtable(&local_d8);
      std::
      _Hashtable<glslang::TIntermBranch_*,_glslang::TIntermBranch_*,_std::allocator<glslang::TIntermBranch_*>,_std::__detail::_Identity,_std::equal_to<glslang::TIntermBranch_*>,_std::hash<glslang::TIntermBranch_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::~_Hashtable(&local_110);
      return;
    }
    local_288._0_8_ = local_288 + 0x10;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_288,local_d8._M_before_begin._M_nxt[1]._M_nxt,
               (long)&(local_d8._M_before_begin._M_nxt[1]._M_nxt)->_M_nxt +
               (long)&(local_d8._M_before_begin._M_nxt[2]._M_nxt)->_M_nxt);
    anon_unknown.dwarf_1617eac::getFrontElement(&local_1d8,(ObjectAccessChain *)local_288);
    pVar12 = std::
             _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glslang::TIntermOperator_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glslang::TIntermOperator_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_false>_>
             ::equal_range(&local_68,&local_1d8);
    local_1e0._M_cur =
         (__node_type *)
         pVar12.second.
         super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glslang::TIntermOperator_*>,_true>
         ._M_cur;
    if ((__node_type *)
        pVar12.first.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glslang::TIntermOperator_*>,_true>
        ._M_cur != local_1e0._M_cur) {
      do {
        local_1e0._M_cur =
             (__node_type *)
             pVar12.second.
             super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glslang::TIntermOperator_*>,_true>
             ._M_cur;
        plVar10 = *(long **)((long)pVar12.first.
                                   super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glslang::TIntermOperator_*>,_true>
                                   ._M_cur.
                                   super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glslang::TIntermOperator_*>,_true>
                            + 0x28);
        bVar5 = anon_unknown.dwarf_1617eac::isAssignOperation(*(TOperator *)(plVar10 + 0x17));
        if (!bVar5) {
          __assert_fail("isAssignOperation(node->getOp())",
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/propagateNoContraction.cpp"
                        ,0x1eb,
                        "std::tuple<bool, ObjectAccessChain> (anonymous namespace)::TNoContractionAssigneeCheckingTraverser::getPrecisenessAndRemainedAccessChain(glslang::TIntermOperator *, const ObjectAccessChain &)"
                       );
        }
        local_268._8_8_ = 0;
        local_268._16_8_ = local_268._16_8_ & 0xffffffffffffff00;
        local_268._0_8_ = local_268 + 0x10;
        local_1e8 = (TSpirvType *)local_288;
        plVar6 = (long *)(**(code **)(*plVar10 + 0x40))(plVar10);
        uVar4 = local_1f8._8_8_;
        if (plVar6 == (long *)0x0) {
          plVar6 = (long *)(**(code **)(*plVar10 + 0x38))(plVar10);
          uVar4 = local_1f8._8_8_;
          if (plVar6 == (long *)0x0) {
            __assert_fail("false",
                          "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/propagateNoContraction.cpp"
                          ,0x213,
                          "std::tuple<bool, ObjectAccessChain> (anonymous namespace)::TNoContractionAssigneeCheckingTraverser::getPrecisenessAndRemainedAccessChain(glslang::TIntermOperator *, const ObjectAccessChain &)"
                         );
          }
          local_2e8 = (key_type)(**(code **)(*plVar6 + 0x188))(plVar6);
          sVar7 = std::
                  _Hashtable<glslang::TIntermTyped_*,_std::pair<glslang::TIntermTyped_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<glslang::TIntermTyped_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<glslang::TIntermTyped_*>,_std::hash<glslang::TIntermTyped_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  ::count((_Hashtable<glslang::TIntermTyped_*,_std::pair<glslang::TIntermTyped_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<glslang::TIntermTyped_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<glslang::TIntermTyped_*>,_std::hash<glslang::TIntermTyped_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                           *)uVar4,&local_2e8);
          if (sVar7 == 0) {
            __assert_fail("accesschain_mapping_.count(UN->getOperand())",
                          "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/propagateNoContraction.cpp"
                          ,0x204,
                          "std::tuple<bool, ObjectAccessChain> (anonymous namespace)::TNoContractionAssigneeCheckingTraverser::getPrecisenessAndRemainedAccessChain(glslang::TIntermOperator *, const ObjectAccessChain &)"
                         );
          }
          plVar8 = (long *)(**(code **)(*plVar6 + 0x188))(plVar6);
          (**(code **)(*plVar8 + 0x10))(plVar8,local_228);
          plVar8 = (long *)(**(code **)(*plVar6 + 0x188))(plVar6);
          plVar8 = (long *)(**(code **)(*plVar8 + 0xf0))(plVar8);
          lVar9 = (**(code **)(*plVar8 + 0x58))(plVar8);
          uVar4 = local_1f8._8_8_;
          uVar2 = *(ulong *)(lVar9 + 8);
          if ((uVar2 & 0x1000000000) == 0) {
            local_2e8 = (key_type)(**(code **)(*plVar6 + 0x188))(plVar6);
            std::__detail::
            _Map_base<glslang::TIntermTyped_*,_std::pair<glslang::TIntermTyped_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<glslang::TIntermTyped_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<glslang::TIntermTyped_*>,_std::hash<glslang::TIntermTyped_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::at((_Map_base<glslang::TIntermTyped_*,_std::pair<glslang::TIntermTyped_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<glslang::TIntermTyped_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<glslang::TIntermTyped_*>,_std::hash<glslang::TIntermTyped_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  *)uVar4,&local_2e8);
            std::__cxx11::string::_M_assign((string *)local_268);
          }
          else {
            local_2e8 = (key_type)local_2d8;
            local_2e0 = 0;
            local_2d8[0] = 0;
            local_2c8._0_8_ = local_2c8 + 0x10;
            unique0x10000e07 = (_Hash_node_base *)((ulong)(uint7)local_2d8._1_7_ << 8);
            pTStack_2b0 = (TString *)local_2d8._8_8_;
            local_2c8._8_8_ = 0;
            local_2a8 = (char *)CONCAT71(local_2a8._1_7_,1);
          }
          if ((uVar2 & 0x1000000000) == 0) goto LAB_004d414e;
        }
        else {
          local_2e8 = (key_type)(**(code **)(*plVar6 + 400))(plVar6);
          sVar7 = std::
                  _Hashtable<glslang::TIntermTyped_*,_std::pair<glslang::TIntermTyped_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<glslang::TIntermTyped_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<glslang::TIntermTyped_*>,_std::hash<glslang::TIntermTyped_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  ::count((_Hashtable<glslang::TIntermTyped_*,_std::pair<glslang::TIntermTyped_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<glslang::TIntermTyped_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<glslang::TIntermTyped_*>,_std::hash<glslang::TIntermTyped_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                           *)uVar4,&local_2e8);
          if (sVar7 == 0) {
            __assert_fail("accesschain_mapping_.count(BN->getLeft())",
                          "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/propagateNoContraction.cpp"
                          ,0x1f1,
                          "std::tuple<bool, ObjectAccessChain> (anonymous namespace)::TNoContractionAssigneeCheckingTraverser::getPrecisenessAndRemainedAccessChain(glslang::TIntermOperator *, const ObjectAccessChain &)"
                         );
          }
          plVar8 = (long *)(**(code **)(*plVar6 + 400))(plVar6);
          (**(code **)(*plVar8 + 0x10))(plVar8,local_228);
          plVar8 = (long *)(**(code **)(*plVar6 + 400))(plVar6);
          plVar8 = (long *)(**(code **)(*plVar8 + 0xf0))(plVar8);
          lVar9 = (**(code **)(*plVar8 + 0x58))(plVar8);
          uVar4 = local_1f8._8_8_;
          if ((*(ulong *)(lVar9 + 8) & 0x1000000000) == 0) {
            local_2e8 = (key_type)(**(code **)(*plVar6 + 400))(plVar6);
            std::__detail::
            _Map_base<glslang::TIntermTyped_*,_std::pair<glslang::TIntermTyped_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<glslang::TIntermTyped_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<glslang::TIntermTyped_*>,_std::hash<glslang::TIntermTyped_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::at((_Map_base<glslang::TIntermTyped_*,_std::pair<glslang::TIntermTyped_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<glslang::TIntermTyped_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<glslang::TIntermTyped_*>,_std::hash<glslang::TIntermTyped_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  *)uVar4,&local_2e8);
            std::__cxx11::string::_M_assign((string *)local_268);
LAB_004d414e:
            pTVar11 = (key_type)(local_2c8 + 0x10);
            lVar9 = std::__cxx11::string::find(local_268,local_288._0_8_,0);
            if (lVar9 == 0) {
              local_2e0 = 0;
              local_2d8[0] = 0;
              unique0x10000e17 = (_Hash_node_base *)((ulong)(uint7)local_2d8._1_7_ << 8);
              pTStack_2b0 = (TString *)local_2d8._8_8_;
              local_2e8 = (key_type)local_2d8;
              local_2c8._0_8_ = pTVar11;
              local_2c8._8_8_ = local_2e0;
            }
            else {
              lVar9 = std::__cxx11::string::find(local_288,local_268._0_8_,0);
              if (lVar9 != 0) {
                local_2e0 = 0;
                local_2d8[0] = 0;
                unique0x10000e0f = (_Hash_node_base *)((ulong)(uint7)local_2d8._1_7_ << 8);
                pTStack_2b0 = (TString *)local_2d8._8_8_;
                local_2c8._8_8_ = 0;
                local_2a8 = (char *)((ulong)local_2a8 & 0xffffffffffffff00);
                local_2e8 = (key_type)local_2d8;
                local_2c8._0_8_ = pTVar11;
                goto LAB_004d4282;
              }
              lVar9 = std::__cxx11::string::find(local_288,local_268._0_8_,0);
              if (lVar9 == 0) {
                std::__cxx11::string::substr((ulong)&local_2e8,(ulong)local_288);
              }
              else {
                local_2e8 = (key_type)local_2d8;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_2e8,local_288._0_8_,
                           (pointer)(local_288._0_8_ + local_288._8_8_));
              }
              if (local_2e8 == (key_type)local_2d8) {
                pTStack_2b0 = (TString *)local_2d8._8_8_;
                local_2c8._0_8_ = pTVar11;
              }
              else {
                local_2c8._0_8_ = local_2e8;
              }
              uStack_2b7 = local_2d8._1_7_;
              local_2c8[0x10] = local_2d8[0];
              local_2c8._8_8_ = local_2e0;
            }
          }
          else {
            local_2d8[0] = 0;
            unique0x10000dff = (_Hash_node_base *)((ulong)(uint7)local_2d8._1_7_ << 8);
            pTStack_2b0 = (TString *)local_2d8._8_8_;
            local_2c8._8_8_ = 0;
            local_2e8 = (key_type)local_2d8;
            local_2c8._0_8_ = (key_type)(local_2c8 + 0x10);
          }
          local_2a8 = (char *)CONCAT71(local_2a8._1_7_,1);
          local_2e0 = local_2c8._8_8_;
        }
LAB_004d4282:
        if ((undefined1 *)local_268._0_8_ != local_268 + 0x10) {
          operator_delete((void *)local_268._0_8_,
                          (ulong)((long)(_Hash_node_base **)local_268._16_8_ + 1));
        }
        if ((char)local_2a8 == '\x01') {
          std::__cxx11::string::_M_assign((string *)&local_140);
          plVar6 = (long *)(**(code **)(*plVar10 + 0x40))(plVar10);
          if (plVar6 == (long *)0x0) {
            plVar6 = (long *)(**(code **)(*plVar10 + 0x38))(plVar10);
            if (plVar6 == (long *)0x0) goto LAB_004d4358;
            bVar5 = anon_unknown.dwarf_1617eac::isAssignOperation(*(TOperator *)(plVar6 + 0x17));
            if (!bVar5) {
              __assert_fail("isAssignOperation(UN->getOp())",
                            "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/propagateNoContraction.cpp"
                            ,0x282,
                            "void (anonymous namespace)::TNoContractionPropagator::propagateNoContractionInOneExpression(glslang::TIntermTyped *, const ObjectAccessChain &)"
                           );
            }
            plVar10 = (long *)(**(code **)(*plVar6 + 0x188))(plVar6);
          }
          else {
            bVar5 = anon_unknown.dwarf_1617eac::isAssignOperation(*(TOperator *)(plVar6 + 0x17));
            if (!bVar5) {
              __assert_fail("isAssignOperation(BN->getOp())",
                            "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/propagateNoContraction.cpp"
                            ,0x27c,
                            "void (anonymous namespace)::TNoContractionPropagator::propagateNoContractionInOneExpression(glslang::TIntermTyped *, const ObjectAccessChain &)"
                           );
            }
            plVar10 = (long *)(**(code **)(*plVar6 + 0x198))(plVar6);
          }
          (**(code **)(*plVar10 + 0x10))(plVar10,&local_1b8);
          bVar5 = anon_unknown.dwarf_1617eac::isArithmeticOperation(*(TOperator *)(plVar6 + 0x17));
          if (bVar5) {
            plVar10 = (long *)(**(code **)(*plVar6 + 0xf8))(plVar6);
            lVar9 = (**(code **)(*plVar10 + 0x50))(plVar10);
            *(ulong *)(lVar9 + 8) = *(ulong *)(lVar9 + 8) | 0x1000000000;
          }
        }
LAB_004d4358:
        if ((key_type)local_2c8._0_8_ != (key_type)(local_2c8 + 0x10)) {
          operator_delete((void *)local_2c8._0_8_,
                          (ulong)((long)&stack0xfffffffffffffd48->_M_nxt + 1));
        }
        _Var3._M_cur = *pVar12.first.
                        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glslang::TIntermOperator_*>,_true>
                        ._M_cur.
                        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glslang::TIntermOperator_*>,_true>
        ;
        pVar12.second.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glslang::TIntermOperator_*>,_true>
        ._M_cur = (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glslang::TIntermOperator_*>,_true>
                   )(_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glslang::TIntermOperator_*>,_true>
                     )local_1e0._M_cur;
        pVar12.first.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glslang::TIntermOperator_*>,_true>
        ._M_cur = (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glslang::TIntermOperator_*>,_true>
                   )(_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glslang::TIntermOperator_*>,_true>
                     )_Var3._M_cur;
      } while (_Var3._M_cur != local_1e0._M_cur);
    }
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::_M_erase(&local_d8,local_288);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
      operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_288._0_8_ != local_288 + 0x10) {
      operator_delete((void *)local_288._0_8_,local_288._16_8_ + 1);
    }
  } while( true );
}

Assistant:

void PropagateNoContraction(const glslang::TIntermediate& intermediate)
{
    // First, traverses the AST, records symbols with their defining operations
    // and collects the initial set of precise symbols (symbol nodes that marked
    // as 'noContraction') and precise return nodes.
    auto mappings_and_precise_objects =
        getSymbolToDefinitionMappingAndPreciseSymbolIDs(intermediate);

    // The mapping of symbol node IDs to their defining nodes. This enables us
    // to get the defining node directly from a given symbol ID without
    // traversing the tree again.
    NodeMapping& symbol_definition_mapping = std::get<0>(mappings_and_precise_objects);

    // The mapping of object nodes to their access chains recorded.
    AccessChainMapping& accesschain_mapping = std::get<1>(mappings_and_precise_objects);

    // The initial set of 'precise' objects which are represented as the
    // access chain toward them.
    ObjectAccesschainSet& precise_object_accesschains = std::get<2>(mappings_and_precise_objects);

    // The set of 'precise' return nodes.
    ReturnBranchNodeSet& precise_return_nodes = std::get<3>(mappings_and_precise_objects);

    // Second, uses the initial set of precise objects as a work list, pops an
    // access chain, extract the symbol ID from it. Then:
    //  1) Check the assignee object, see if it is 'precise' object node or
    //  contains 'precise' object. Obtain the incremental access chain from the
    //  assignee node to its nested 'precise' node (if any).
    //  2) If the assignee object node is 'precise' or it contains 'precise'
    //  objects, traverses the right side of the assignment operation
    //  expression to mark arithmetic operations as 'noContration' and update
    //  'precise' access chain work list with new found object nodes.
    // Repeat above steps until the work list is empty.
    TNoContractionAssigneeCheckingTraverser checker(accesschain_mapping);
    TNoContractionPropagator propagator(&precise_object_accesschains, accesschain_mapping);

    // We have two initial precise work lists to handle:
    //  1) precise return nodes
    //  2) precise object access chains
    // We should process the precise return nodes first and the involved
    // objects in the return expression should be added to the precise object
    // access chain set.
    while (!precise_return_nodes.empty()) {
        glslang::TIntermBranch* precise_return_node = *precise_return_nodes.begin();
        propagator.propagateNoContractionInReturnNode(precise_return_node);
        precise_return_nodes.erase(precise_return_node);
    }

    while (!precise_object_accesschains.empty()) {
        // Get the access chain of a precise object from the work list.
        ObjectAccessChain precise_object_accesschain = *precise_object_accesschains.begin();
        // Get the symbol id from the access chain.
        ObjectAccessChain symbol_id = getFrontElement(precise_object_accesschain);
        // Get all the defining nodes of that symbol ID.
        std::pair<NodeMapping::iterator, NodeMapping::iterator> range =
            symbol_definition_mapping.equal_range(symbol_id);
        // Visits all the assignment nodes of that symbol ID and
        //  1) Check if the assignee node is 'precise' or contains 'precise'
        //  objects.
        //  2) Propagate the 'precise' to the top layer object nodes
        //  in the right side of the assignment operation, update the 'precise'
        //  work list with new access chains representing the new 'precise'
        //  objects, and mark arithmetic operations as 'noContraction'.
        for (NodeMapping::iterator defining_node_iter = range.first;
             defining_node_iter != range.second; defining_node_iter++) {
            TIntermOperator* defining_node = defining_node_iter->second;
            // Check the assignee node.
            auto checker_result = checker.getPrecisenessAndRemainedAccessChain(
                defining_node, precise_object_accesschain);
            bool& contain_precise = std::get<0>(checker_result);
            ObjectAccessChain& remained_accesschain = std::get<1>(checker_result);
            // If the assignee node is 'precise' or contains 'precise', propagate the
            // 'precise' to the right. Otherwise just skip this assignment node.
            if (contain_precise) {
                propagator.propagateNoContractionInOneExpression(defining_node,
                                                                 remained_accesschain);
            }
        }
        // Remove the last processed 'precise' object from the work list.
        precise_object_accesschains.erase(precise_object_accesschain);
    }
}